

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS.cpp
# Opt level: O1

NS * __thiscall NS::clear(NS *this)

{
  pointer ppNVar1;
  vector<N_*,_std::allocator<N_*>_> *__range1;
  pointer ppNVar2;
  N *n;
  anon_class_8_1_54a3980e local_40;
  N *local_38;
  
  ppNVar2 = (this->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppNVar1 = (this->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppNVar2 != ppNVar1) {
    do {
      local_38 = *ppNVar2;
      local_40.n = &local_38;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__deduce_visit_result<void>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Adam-Vandervorst[P]NestedT/src/NS.cpp:34:20)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>_&>
        ::_S_vtable._M_arr
        [*(__index_type *)
          ((long)&(local_38->data).
                  super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
                  .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
                  super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
                  super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
                  super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
                  super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>
          + 0x20)]._M_data)(&local_40,&local_38->data);
      ppNVar2 = ppNVar2 + 1;
    } while (ppNVar2 != ppNVar1);
  }
  ppNVar2 = (this->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
      _M_finish != ppNVar2) {
    (this->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = ppNVar2;
  }
  return this;
}

Assistant:

NS* NS::clear(){
    for (auto n : _os)
        std::visit([&](auto &&data){
            if constexpr (std::is_same_v<std::decay_t<decltype(data)>, NS*>) delete data->clear();
            delete n;
        }, n->data);
    _os.clear();
    return this;
}